

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void anon_unknown.dwarf_39a3::Test_TemplateDictionary_SetValueWithoutCopy::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  char *pcVar3;
  bool bVar4;
  char *pcVar5;
  TemplateString local_308;
  TemplateString local_2e8;
  TemplateString local_2c8;
  TemplateString local_2a8;
  TemplateDictionaryPeer local_288;
  TemplateDictionaryPeer peer;
  size_t sStack_278;
  undefined8 local_270;
  TemplateId TStack_268;
  TemplateString local_260;
  char *local_240;
  void *ptr;
  char value [32];
  TemplateString local_200;
  TemplateDictionary local_1e0 [8];
  TemplateDictionary dict;
  undefined1 local_170 [8];
  UnsafeArena arena;
  
  ctemplate::UnsafeArena::UnsafeArena((UnsafeArena *)local_170,100);
  ctemplate::TemplateString::TemplateString(&local_200,"Test arena");
  ctemplate::TemplateDictionary::TemplateDictionary(local_1e0,&local_200,(UnsafeArena *)local_170);
  snprintf((char *)&ptr,0x20,"%s","value");
  local_240 = ctemplate::UnsafeArena::Alloc((UnsafeArena *)local_170,0);
  ctemplate::TemplateString::TemplateString(&local_260,"key");
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,(char *)&ptr);
  TVar1.length_ = local_260.length_;
  TVar1.ptr_ = local_260.ptr_;
  TVar1.is_immutable_ = local_260.is_immutable_;
  TVar1._17_7_ = local_260._17_7_;
  TVar1.id_ = local_260.id_;
  TVar2.length_ = sStack_278;
  TVar2.ptr_ = (char *)peer.dict_;
  TVar2._16_8_ = local_270;
  TVar2.id_ = TStack_268;
  ctemplate::TemplateDictionary::SetValueWithoutCopy(TVar1,TVar2);
  pcVar3 = local_240;
  pcVar5 = ctemplate::UnsafeArena::Alloc((UnsafeArena *)local_170,0);
  if (pcVar3 != pcVar5) {
    fprintf(_stderr,"Check failed: %s %s %s\n","ptr","==","arena.Alloc(0)");
    exit(1);
  }
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_288,local_1e0);
  ctemplate::TemplateString::TemplateString(&local_2a8,"key");
  ctemplate::TemplateString::TemplateString(&local_2c8,"value");
  bVar4 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_288,&local_2a8,&local_2c8);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    snprintf((char *)&ptr,0x20,"%s","not_value");
    ctemplate::TemplateString::TemplateString(&local_2e8,"key");
    ctemplate::TemplateString::TemplateString(&local_308,"not_v");
    bVar4 = ctemplate::TemplateDictionaryPeer::ValueIs(&local_288,&local_2e8,&local_308);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      ctemplate::TemplateDictionary::~TemplateDictionary(local_1e0);
      ctemplate::UnsafeArena::~UnsafeArena((UnsafeArena *)local_170);
      return;
    }
    fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"key\", \"not_v\")");
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n","peer.ValueIs(\"key\", \"value\")");
  exit(1);
}

Assistant:

TEST(TemplateDictionary, SetValueWithoutCopy) {
  UnsafeArena arena(100);
  TemplateDictionary dict("Test arena", &arena);

  char value[32];
  snprintf(value, sizeof(value), "%s", "value");

  const void* const ptr = arena.Alloc(0);
  dict.SetValueWithoutCopy("key", value);
  // We shouldn't have copied the value string.
  EXPECT_EQ(ptr, arena.Alloc(0));

  TemplateDictionaryPeer peer(&dict);
  EXPECT_TRUE(peer.ValueIs("key", "value"));
  // If our content changes, so does what's in the dictionary -- but
  // only the contents of the buffer, not its length!
  snprintf(value, sizeof(value), "%s", "not_value");
  EXPECT_TRUE(peer.ValueIs("key", "not_v"));   // sizeof("not_v") == sizeof("value")
}